

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O1

void __thiscall
cpsm::testing::Matches::assert_match_index(Matches *this,string_ref item,size_type expected_index)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  TestAssertionFailure *this_00;
  unsigned_long args_3;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::basic_string_ref<char,std::char_traits<char>>const>>
                    ((this->matches).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->matches).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  args_3 = (long)_Var1._M_current -
           (long)(this->matches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (args_3 == expected_index) {
    return;
  }
  this_00 = (TestAssertionFailure *)__cxa_allocate_exception(0x28);
  TestAssertionFailure::
  TestAssertionFailure<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*,unsigned_long,char_const*,unsigned_long>
            (this_00,"expected \'",item,"\' (index ",args_3,") to have index ",expected_index);
  __cxa_throw(this_00,&TestAssertionFailure::typeinfo,TestAssertionFailure::~TestAssertionFailure);
}

Assistant:

void assert_match_index(boost::string_ref const item,
                          size_type const expected_index) const {
    auto const index = match_index(item);
    if (index != expected_index) {
      throw TestAssertionFailure("expected '", item, "' (index ", index,
                                 ") to have index ", expected_index);
    }
  }